

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O3

void linenoiseEditBackspace(linenoiseState *l)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  
  if ((l->pos != 0) && (l->len != 0)) {
    iVar1 = (*(code *)prevCharLen)(l->buf,l->len,l->pos,0);
    lVar3 = (long)iVar1;
    memmove(l->buf + l->pos + -lVar3,l->buf + l->pos,l->len - l->pos);
    l->pos = l->pos - lVar3;
    sVar2 = l->len - lVar3;
    l->len = sVar2;
    l->buf[sVar2] = '\0';
    iVar1 = getColumns(0,1);
    l->cols = (long)iVar1;
    refreshLineWithFlags(l,3);
    return;
  }
  return;
}

Assistant:

void linenoiseEditBackspace(struct linenoiseState *l) {
    if (l->pos > 0 && l->len > 0) {
        int chlen = prevCharLen(l->buf,l->len,l->pos,NULL);
        memmove(l->buf+l->pos-chlen,l->buf+l->pos,l->len-l->pos);
        l->pos-=chlen;
        l->len-=chlen;
        l->buf[l->len] = '\0';
        refreshLine(l);
    }
}